

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O0

bool __thiscall BasePort::ReadAllBoardsBroadcast(BasePort *this)

{
  double *pdVar1;
  double dVar2;
  uchar *puVar3;
  BoardIO *this_00;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  __uint32_t _Var9;
  ostream *poVar10;
  void *pvVar11;
  ushort uVar12;
  bool bVar13;
  double extraout_XMM0_Qa;
  uint local_f8;
  uint32_t overflow_val_2;
  uint32_t overflow_val_1;
  quadlet_t timingInfo;
  BoardIO *board_1;
  uint bnum;
  uint16_t overflow_val;
  uint quad0_lsb;
  uint bdReadSize;
  uint seq_expected;
  bool thisOK;
  BoardIO *board;
  uint boardNum;
  uint thisBoard;
  uint numAxes;
  quadlet_t statusQuad;
  size_t i;
  uint index;
  uint bdCnt;
  quadlet_t *curPtr;
  double clkPeriod;
  bool ret;
  quadlet_t *hubReadBuffer;
  bool rtRead;
  bool noneRead;
  bool allOK;
  allocator<char> local_39;
  string local_38 [32];
  BasePort *local_18;
  BasePort *this_local;
  
  local_18 = this;
  uVar6 = (*this->_vptr_BasePort[0x11])();
  if ((uVar6 & 1) == 0) {
    poVar10 = std::operator<<(this->outStr,"BasePort::ReadAllBoardsBroadcast: port not initialized")
    ;
    std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
    (*this->_vptr_BasePort[8])();
    this_local._7_1_ = false;
  }
  else {
    bVar5 = IsBroadcastFirmwareMixValid(this);
    if (bVar5) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_38,"ReadAllBoardsBroadcast",&local_39);
      iVar7 = (*this->_vptr_BasePort[0x1b])(this,local_38,(ulong)(this->autoReScan & 1));
      std::__cxx11::string::~string(local_38);
      std::allocator<char>::~allocator(&local_39);
      if ((((byte)iVar7 ^ 0xff) & 1) == 0) {
        bVar5 = true;
        bVar4 = true;
        BroadcastReadInfo::IncrementSequence(&this->bcReadInfo);
        uVar6 = (*this->_vptr_BasePort[0x29])(this,(ulong)(this->bcReadInfo).readSequence);
        if ((uVar6 & 1) == 0) {
          poVar10 = std::operator<<(this->outStr,
                                    "BasePort::ReadAllBoardsBroadcast: failed to send broadcast read request, seq = "
                                   );
          pvVar11 = (void *)std::ostream::operator<<(poVar10,(this->bcReadInfo).readSequence);
          std::ostream::operator<<(pvVar11,std::endl<char,std::char_traits<char>>);
          (*this->_vptr_BasePort[8])();
          this_local._7_1_ = false;
        }
        else {
          (*this->_vptr_BasePort[0x2a])();
          BroadcastReadInfo::PrepareForRead(&this->bcReadInfo);
          puVar3 = this->ReadBufferBroadcast;
          uVar6 = (*this->_vptr_BasePort[0x18])();
          uVar8 = (*this->_vptr_BasePort[0x14])();
          _index = (__uint32_t *)(puVar3 + (ulong)uVar8 + (ulong)uVar6);
          memset(_index,0,(ulong)(this->bcReadInfo).readSizeQuads << 2);
          uVar6 = (*this->_vptr_BasePort[0x2b])
                            (this,_index,(ulong)((this->bcReadInfo).readSizeQuads << 2));
          if ((uVar6 & 1) == 0) {
            SetReadInvalid(this);
            (*this->_vptr_BasePort[8])();
            this_local._7_1_ = false;
          }
          else {
            (*this->_vptr_BasePort[0x20])();
            i._4_4_ = 0;
            i._0_4_ = 0;
LAB_001170ea:
            bVar13 = false;
            if ((uint)i < 0x10) {
              bVar13 = i._4_4_ < this->NumOfBoards_;
            }
            if (bVar13) {
              if ((*_index == 0) || (_index[2] == 0)) {
                poVar10 = std::operator<<(this->outStr,
                                          "BasePort::ReadAllBoardsBroadcast: invalid block after reading "
                                         );
                poVar10 = (ostream *)std::ostream::operator<<(poVar10,i._4_4_);
                poVar10 = std::operator<<(poVar10," boards");
                std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
                std::operator<<(this->outStr,"Failed to read from board(s) ");
                for (_numAxes = 0; _numAxes < 0x10; _numAxes = _numAxes + 1) {
                  if ((((this->bcReadInfo).boardInfo[_numAxes].inUse & 1U) != 0) &&
                     (((this->bcReadInfo).boardInfo[_numAxes].updated & 1U) == 0)) {
                    poVar10 = (ostream *)std::ostream::operator<<(this->outStr,_numAxes);
                    std::operator<<(poVar10," ");
                  }
                }
                std::ostream::operator<<(this->outStr,std::endl<char,std::char_traits<char>>);
                bVar5 = false;
              }
              else {
                _Var9 = __bswap_32(_index[2]);
                if (((this->IsAllBoardsRev8_9_ & 1U) == 0) && (_Var9 >> 0x1c != 4)) {
                  poVar10 = std::operator<<(this->outStr,
                                            "BasePort::ReadAllBoardsBroadcast: invalid status (not a 4 axis board): "
                                           );
                  pvVar11 = (void *)std::ostream::operator<<(poVar10,std::hex);
                  pvVar11 = (void *)std::ostream::operator<<(pvVar11,_Var9);
                  pvVar11 = (void *)std::ostream::operator<<(pvVar11,std::dec);
                  std::ostream::operator<<(pvVar11,std::endl<char,std::char_traits<char>>);
                  bVar5 = false;
                }
                else {
                  uVar6 = (_Var9 & 0xf000000) >> 0x18;
                  uVar8 = (*this->_vptr_BasePort[0x1f])();
                  local_f8 = uVar6;
                  if ((uVar8 & 1) != 0) {
                    local_f8 = (uint)i;
                  }
                  this_00 = this->BoardList[local_f8];
                  if ((this_00 == (BoardIO *)0x0) || (local_f8 == uVar6)) goto LAB_00117393;
                  poVar10 = std::operator<<(this->outStr,
                                            "BasePort::ReadAllBoardsBroadcast: board mismatch, expecting "
                                           );
                  poVar10 = (ostream *)std::ostream::operator<<(poVar10,local_f8);
                  poVar10 = std::operator<<(poVar10,", found ");
                  pvVar11 = (void *)std::ostream::operator<<(poVar10,uVar6);
                  std::ostream::operator<<(pvVar11,std::endl<char,std::char_traits<char>>);
                  bVar5 = false;
                }
              }
            }
            if (bVar5 == false) {
              for (board_1._0_4_ = 0; (uint)board_1 < 0x10; board_1._0_4_ = (uint)board_1 + 1) {
                if (((this->BoardList[(uint)board_1] != (BoardIO *)0x0) &&
                    (((this->bcReadInfo).boardInfo[(uint)board_1].inUse & 1U) != 0)) &&
                   (((this->bcReadInfo).boardInfo[(uint)board_1].updated & 1U) == 0)) {
                  BoardIO::SetReadValid(this->BoardList[(uint)board_1],false);
                }
              }
              (this->bcReadInfo).readStartTime = 0.0;
              (this->bcReadInfo).readFinishTime = 0.0;
              (this->bcReadInfo).gapTime = 0.0;
            }
            else if (((this->IsAllBoardsRev7_ & 1U) != 0) || ((this->IsAllBoardsRev8_9_ & 1U) != 0))
            {
              _Var9 = __bswap_32(*_index);
              (this->bcReadInfo).readStartTime = (double)(_Var9 >> 0x10) * extraout_XMM0_Qa;
              (this->bcReadInfo).readFinishTime = (double)(_Var9 & 0xffff) * extraout_XMM0_Qa;
              if (_Var9 != 0) {
                if ((this->bcReadInfo).readStartTime < (this->bcReadInfo).updateFinishTime) {
                  uVar6 = 0x10000;
                  if (this->FirmwareVersion[this->HubBoard] < 9) {
                    uVar6 = 0x4000;
                  }
                  (this->bcReadInfo).readStartTime =
                       (double)uVar6 * extraout_XMM0_Qa + (this->bcReadInfo).readStartTime;
                  (this->bcReadInfo).readOverflow = true;
                }
                if ((this->bcReadInfo).readFinishTime < (this->bcReadInfo).readStartTime) {
                  uVar6 = 0x10000;
                  if (this->FirmwareVersion[this->HubBoard] < 9) {
                    uVar6 = 0x4000;
                  }
                  (this->bcReadInfo).readFinishTime =
                       (double)uVar6 * extraout_XMM0_Qa + (this->bcReadInfo).readFinishTime;
                  (this->bcReadInfo).readOverflow = true;
                }
              }
              if (_Var9 == 0) {
                (this->bcReadInfo).gapTime = 0.0;
              }
              else {
                (this->bcReadInfo).gapTime =
                     (this->bcReadInfo).readStartTime - (this->bcReadInfo).updateFinishTime;
                if ((this->bcReadInfo).gapTime < (this->bcReadInfo).gapTimeMin) {
                  (this->bcReadInfo).gapTimeMin = (this->bcReadInfo).gapTime;
                }
                dVar2 = (this->bcReadInfo).gapTime;
                pdVar1 = &(this->bcReadInfo).gapTimeMax;
                if (*pdVar1 <= dVar2 && dVar2 != *pdVar1) {
                  (this->bcReadInfo).gapTimeMax = (this->bcReadInfo).gapTime;
                }
              }
            }
            this_local._7_1_ = bVar5;
            if (bVar4) {
              (*this->_vptr_BasePort[8])();
            }
          }
        }
      }
      else {
        SetReadInvalid(this);
        (*this->_vptr_BasePort[8])();
        this_local._7_1_ = false;
      }
    }
    else {
      poVar10 = std::operator<<(this->outStr,
                                "BasePort::ReadAllBoardsBroadcast: invalid mix of firmware");
      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
      (*this->_vptr_BasePort[8])();
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
LAB_00117393:
  if ((((this->bcReadInfo).boardInfo[local_f8].inUse & 1U) == 0) || (this_00 == (BoardIO *)0x0)) {
    if ((this->IsAllBoardsRev4_6_ & 1U) != 0) {
      _index = _index + 0x11;
    }
  }
  else {
    (this->bcReadInfo).boardInfo[local_f8].updated = true;
    (this->bcReadInfo).boardInfo[local_f8].blockNum = i._4_4_;
    _Var9 = __bswap_32(*_index);
    (this->bcReadInfo).boardInfo[local_f8].sequence = _Var9 >> 0x10;
    quad0_lsb = (this->bcReadInfo).readSequence;
    if ((this->IsAllBoardsRev8_9_ & 1U) == 0) {
      (this->bcReadInfo).boardInfo[local_f8].seq_error =
           (this->bcReadInfo).boardInfo[local_f8].sequence != quad0_lsb;
      uVar6 = 0x11;
      if ((this->IsAllBoardsRev7_ & 1U) != 0) {
        uVar6 = 0x1d;
      }
      (this->bcReadInfo).boardInfo[local_f8].blockSize = uVar6;
    }
    else {
      quad0_lsb = quad0_lsb & 0xff;
      (this->bcReadInfo).boardInfo[local_f8].sequence =
           (this->bcReadInfo).boardInfo[local_f8].sequence & 0xff;
      _Var9 = __bswap_32(*_index);
      (this->bcReadInfo).boardInfo[local_f8].seq_error = (_Var9 & 0x8000) != 0;
      if ((this->bcReadInfo).boardInfo[local_f8].sequence != quad0_lsb) {
        (this->bcReadInfo).boardInfo[local_f8].seq_error = true;
      }
      _Var9 = __bswap_32(*_index);
      (this->bcReadInfo).boardInfo[local_f8].blockSize = _Var9 >> 0x18;
      uVar6 = (*this_00->_vptr_BoardIO[1])();
      uVar6 = (uVar6 >> 2) + 1;
      if ((this->bcReadInfo).boardInfo[local_f8].blockSize != uVar6) {
        poVar10 = std::operator<<(this->outStr,"BasePort::ReadAllBoardsBroadcast: board ");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,local_f8);
        poVar10 = std::operator<<(poVar10,", blockSize = ");
        poVar10 = (ostream *)
                  std::ostream::operator<<(poVar10,(this->bcReadInfo).boardInfo[local_f8].blockSize)
        ;
        poVar10 = std::operator<<(poVar10,", expected = ");
        pvVar11 = (void *)std::ostream::operator<<(poVar10,uVar6);
        std::ostream::operator<<(pvVar11,std::endl<char,std::char_traits<char>>);
      }
    }
    if (((this->IsAllBoardsRev7_ & 1U) != 0) || ((this->IsAllBoardsRev8_9_ & 1U) != 0)) {
      _Var9 = __bswap_32(*_index);
      (this->bcReadInfo).boardInfo[local_f8].updateTime =
           (double)(_Var9 & 0x7fff) * extraout_XMM0_Qa;
      if (((this->bcReadInfo).boardInfo[local_f8].seq_error & 1U) == 0) {
        if ((this->bcReadInfo).boardInfo[local_f8].updateTime < (this->bcReadInfo).updateFinishTime)
        {
          uVar12 = 0x8000;
          if (this->FirmwareVersion[this->HubBoard] < 9) {
            uVar12 = 0x4000;
          }
          (this->bcReadInfo).boardInfo[local_f8].updateTime =
               (double)uVar12 * extraout_XMM0_Qa + (this->bcReadInfo).boardInfo[local_f8].updateTime
          ;
          (this->bcReadInfo).updateOverflow = true;
        }
        if ((this->bcReadInfo).boardInfo[local_f8].updateTime < (this->bcReadInfo).updateStartTime)
        {
          (this->bcReadInfo).updateStartTime = (this->bcReadInfo).boardInfo[local_f8].updateTime;
        }
        dVar2 = (this->bcReadInfo).boardInfo[local_f8].updateTime;
        pdVar1 = &(this->bcReadInfo).updateFinishTime;
        if (*pdVar1 <= dVar2 && dVar2 != *pdVar1) {
          (this->bcReadInfo).updateFinishTime = (this->bcReadInfo).boardInfo[local_f8].updateTime;
        }
      }
    }
    bVar13 = ((this->bcReadInfo).boardInfo[local_f8].seq_error & 1U) != 0;
    if (bVar13) {
      poVar10 = std::operator<<(this->outStr,"BasePort::ReadAllBoardsBroadcast: board ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,local_f8);
      poVar10 = std::operator<<(poVar10,", seq = ");
      poVar10 = (ostream *)
                std::ostream::operator<<(poVar10,(this->bcReadInfo).boardInfo[local_f8].sequence);
      poVar10 = std::operator<<(poVar10,", expected = ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,quad0_lsb);
      poVar10 = std::operator<<(poVar10,", diff = ");
      pvVar11 = (void *)std::ostream::operator<<
                                  (poVar10,quad0_lsb -
                                           (this->bcReadInfo).boardInfo[local_f8].sequence);
      std::ostream::operator<<(pvVar11,std::endl<char,std::char_traits<char>>);
    }
    bdReadSize._3_1_ = !bVar13;
    BoardIO::SetReadValid(this_00,bdReadSize._3_1_);
    if (bdReadSize._3_1_) {
      (*this_00->_vptr_BoardIO[2])();
      bVar4 = false;
    }
    else {
      bVar5 = false;
    }
    _index = _index + (this->bcReadInfo).boardInfo[local_f8].blockSize;
    i._4_4_ = i._4_4_ + 1;
  }
  i._0_4_ = (uint)i + 1;
  goto LAB_001170ea;
}

Assistant:

bool BasePort::ReadAllBoardsBroadcast(void)
{
    if (!IsOK()) {
        outStr << "BasePort::ReadAllBoardsBroadcast: port not initialized" << std::endl;
        OnNoneRead();
        return false;
    }

    if (!IsBroadcastFirmwareMixValid()) {
        outStr << "BasePort::ReadAllBoardsBroadcast: invalid mix of firmware" << std::endl;
        OnNoneRead();
        return false;
    }

    if (!CheckFwBusGeneration("ReadAllBoardsBroadcast", autoReScan)) {
        SetReadInvalid();
        OnNoneRead();
        return false;
    }

    bool allOK = true;
    bool noneRead = true;

    //--- send out broadcast read request -----

    bool rtRead = true;
    bcReadInfo.IncrementSequence();

    if (!WriteBroadcastReadRequest(bcReadInfo.readSequence)) {
        outStr << "BasePort::ReadAllBoardsBroadcast: failed to send broadcast read request, seq = "
               << bcReadInfo.readSequence << std::endl;
        OnNoneRead();
        return false;
    }

    // Wait for broadcast read data
    WaitBroadcastRead();

    bcReadInfo.PrepareForRead();

    quadlet_t *hubReadBuffer = reinterpret_cast<quadlet_t *>(ReadBufferBroadcast + GetReadQuadAlign() + GetPrefixOffset(RD_FW_BDATA));
    memset(hubReadBuffer, 0, bcReadInfo.readSizeQuads*sizeof(quadlet_t));
    bool ret = ReceiveBroadcastReadResponse(hubReadBuffer, bcReadInfo.readSizeQuads*sizeof(quadlet_t));
    if (!ret) {
        SetReadInvalid();
        OnNoneRead();
        return false;
    }

    double clkPeriod = GetBroadcastReadClockPeriod();
    quadlet_t *curPtr = hubReadBuffer;
    unsigned int bdCnt = 0;   // Number of board processed
    // Loop through all boards, processing the boards in use.
    // Note that prior to Firmware Rev 7, we always read data for all 16 boards.
    // Starting with Firmware Rev 9, the board data will generally not be in sequential order
    // (i.e., isBroadcastReadOrdered will return false) for the Ethernet-only interface.
    for (unsigned int index = 0; (index < BoardIO::MAX_BOARDS) && (bdCnt < NumOfBoards_); index++) {
        if ((curPtr[0] == 0) || (curPtr[2] == 0)) {
            outStr << "BasePort::ReadAllBoardsBroadcast: invalid block after reading "
                   << bdCnt << " boards" << std::endl;
            outStr << "Failed to read from board(s) ";
            for (size_t i = 0; i < BoardIO::MAX_BOARDS; i++) {
                if (bcReadInfo.boardInfo[i].inUse && !bcReadInfo.boardInfo[i].updated)
                    outStr << i << " ";
            }
            outStr << std::endl;
            allOK = false;
            break;
        }
        quadlet_t statusQuad = bswap_32(curPtr[2]);
        unsigned int numAxes = (statusQuad&0xf0000000)>>28;
        if (!IsAllBoardsRev8_9_ && (numAxes != 4)) {
            outStr << "BasePort::ReadAllBoardsBroadcast: invalid status (not a 4 axis board): " << std::hex << statusQuad
                   << std::dec << std::endl;
            allOK = false;
            break;
        }
        unsigned int thisBoard = (statusQuad&0x0f000000)>>24;
        unsigned int boardNum = isBroadcastReadOrdered() ? index : thisBoard;
        BoardIO *board = BoardList[boardNum];
        if (board && (boardNum != thisBoard)) {
            outStr << "BasePort::ReadAllBoardsBroadcast: board mismatch, expecting "
                   << boardNum << ", found " << thisBoard << std::endl;
            allOK = false;
            break;
        }
        if (bcReadInfo.boardInfo[boardNum].inUse && board) {
            bool thisOK = false;
            bcReadInfo.boardInfo[boardNum].updated = true;
            bcReadInfo.boardInfo[boardNum].blockNum = bdCnt++;
            bcReadInfo.boardInfo[boardNum].sequence = bswap_32(curPtr[0]) >> 16;
            unsigned int seq_expected = bcReadInfo.readSequence;
            if (IsAllBoardsRev8_9_) {
                // For Rev 8+, only the LSB of the sequence is returned, but bit 15 also indicates
                // whether the 16-bit sequence number did not match on the FPGA side.
                seq_expected &= 0x00ff;
                bcReadInfo.boardInfo[boardNum].sequence &= 0x00ff;  // lowest byte only
                bcReadInfo.boardInfo[boardNum].seq_error = bswap_32(curPtr[0]) & 0x00008000;  // bit 15
                if (bcReadInfo.boardInfo[boardNum].sequence != seq_expected)
                    bcReadInfo.boardInfo[boardNum].seq_error = true;
                bcReadInfo.boardInfo[boardNum].blockSize = (bswap_32(curPtr[0]) & 0xff000000) >> 24;
                unsigned int bdReadSize = board->GetReadNumBytes()/sizeof(quadlet_t) + 1;
                if (bcReadInfo.boardInfo[boardNum].blockSize != bdReadSize) {
                    outStr << "BasePort::ReadAllBoardsBroadcast: board " << boardNum
                           << ", blockSize = " << bcReadInfo.boardInfo[boardNum].blockSize
                           << ", expected = " << bdReadSize << std::endl;
                }
            }
            else {
                bcReadInfo.boardInfo[boardNum].seq_error = (bcReadInfo.boardInfo[boardNum].sequence != seq_expected);
                // Rev7 block size is 29 (1 + 28), Rev4_6 block size is 17 (should have been 21)
                bcReadInfo.boardInfo[boardNum].blockSize = IsAllBoardsRev7_ ? 29 : 17;
            }
            if (IsAllBoardsRev7_ || IsAllBoardsRev8_9_) {
                unsigned int quad0_lsb = bswap_32(curPtr[0])&0x0000ffff;
                bcReadInfo.boardInfo[boardNum].updateTime = (quad0_lsb&0x7fff)*clkPeriod;
                if (!bcReadInfo.boardInfo[boardNum].seq_error) {
                    // Set the update Start/Finish times based on the minimum and maximum update times
                    // Note that update times should be increasing, so if our current updateTime is
                    // less than the previous max (updateFinishTime), then there must have been overflow
                    if (bcReadInfo.boardInfo[boardNum].updateTime < bcReadInfo.updateFinishTime) {
                        // Firmware Rev 9 uses 15 bits; prior versions use 14 bits
                        uint16_t overflow_val = (FirmwareVersion[HubBoard] < 9) ? 0x4000 : 0x8000;
                        bcReadInfo.boardInfo[boardNum].updateTime += overflow_val*clkPeriod;
                        bcReadInfo.updateOverflow = true;
                    }
                    if (bcReadInfo.boardInfo[boardNum].updateTime < bcReadInfo.updateStartTime)
                        bcReadInfo.updateStartTime = bcReadInfo.boardInfo[boardNum].updateTime;
                    if (bcReadInfo.boardInfo[boardNum].updateTime > bcReadInfo.updateFinishTime)
                        bcReadInfo.updateFinishTime = bcReadInfo.boardInfo[boardNum].updateTime;
                }
            }
            if (!bcReadInfo.boardInfo[boardNum].seq_error) {
                thisOK = true;
            }
            else {
                outStr << "BasePort::ReadAllBoardsBroadcast: board " << boardNum
                       << ", seq = " << bcReadInfo.boardInfo[boardNum].sequence
                       << ", expected = " << seq_expected
                       << ", diff = " << static_cast<int>(seq_expected-bcReadInfo.boardInfo[boardNum].sequence)
                       << std::endl;
            }
            board->SetReadValid(thisOK);
            if (thisOK) {
                board->SetReadData(curPtr+1);
                noneRead = false;
            }
            else {
                allOK = false;
            }
            curPtr += bcReadInfo.boardInfo[boardNum].blockSize;
        }
        else if (IsAllBoardsRev4_6_) {
            // Skip unused boards for firmware < 7
            // Rev4_6 block size is 17 (should have been 21)
            curPtr += 17;
        }
    }

    if (!allOK) {
        for (unsigned int bnum = 0; bnum < BoardIO::MAX_BOARDS; bnum++) {
            BoardIO *board = BoardList[bnum];
            if (board && bcReadInfo.boardInfo[bnum].inUse && !bcReadInfo.boardInfo[bnum].updated) {
               board->SetReadValid(false);
            }
        }
        bcReadInfo.readStartTime = 0.0;
        bcReadInfo.readFinishTime = 0.0;
        bcReadInfo.gapTime = 0.0;
    }
    else if (IsAllBoardsRev7_ || IsAllBoardsRev8_9_) {
        quadlet_t timingInfo = bswap_32(curPtr[0]);
        bcReadInfo.readStartTime = ((timingInfo&0xffff0000) >> 16)*clkPeriod;
        bcReadInfo.readFinishTime = (timingInfo&0x0000ffff)*clkPeriod;
        if (timingInfo != 0) {
            // timingInfo == 0 indicates invalid data
            if (bcReadInfo.readStartTime < bcReadInfo.updateFinishTime) {
                // Firmware Rev 9 uses 16 bits; prior versions use 14 bits
                uint32_t overflow_val = (FirmwareVersion[HubBoard] < 9) ? 0x00004000 : 0x00010000;
                bcReadInfo.readStartTime += overflow_val*clkPeriod;
                bcReadInfo.readOverflow = true;
            }
            if (bcReadInfo.readFinishTime < bcReadInfo.readStartTime) {
                // Firmware Rev 9 uses 16 bits; prior versions use 14 bits
                uint32_t overflow_val = (FirmwareVersion[HubBoard] < 9) ? 0x00004000 : 0x00010000;
                bcReadInfo.readFinishTime += overflow_val*clkPeriod;
                bcReadInfo.readOverflow = true;
            }
        }
        // Gap between end of update and start of read; this can be tuned to be as
        // close to 0 as possible.
        if (timingInfo == 0) {
            bcReadInfo.gapTime = 0.0;
        }
        else {
            bcReadInfo.gapTime = bcReadInfo.readStartTime - bcReadInfo.updateFinishTime;
            if (bcReadInfo.gapTime < bcReadInfo.gapTimeMin)
                bcReadInfo.gapTimeMin = bcReadInfo.gapTime;
            if (bcReadInfo.gapTime > bcReadInfo.gapTimeMax)
                bcReadInfo.gapTimeMax = bcReadInfo.gapTime;
        }
    }

    if (noneRead) {
        OnNoneRead();
    }
    if (!rtRead)
        outStr << "BasePort::ReadAllBoardsBroadcast: rtRead is false" << std::endl;

#if 0
    if (IsAllBoardsRev7_ || IsAllBoardsRev8_9_) {
        bcReadInfo.PrintTiming(outStr);
    }
#endif

    return allOK;
}